

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_mirror(SemanticParser *this,SP *in)

{
  bool bVar1;
  runtime_error *prVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  SP SVar3;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffea8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffeb0;
  undefined6 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebe;
  undefined1 in_stack_fffffffffffffebf;
  element_type *in_stack_fffffffffffffec0;
  element_type *__args;
  undefined7 in_stack_fffffffffffffef8;
  undefined1 uVar4;
  SP *in_stack_ffffffffffffff00;
  SemanticParser *in_stack_ffffffffffffff08;
  string local_e0 [64];
  string local_a0 [40];
  string *in_stack_ffffffffffffff88;
  float *in_stack_ffffffffffffff90;
  ParamSet *in_stack_ffffffffffffff98;
  string *in_stack_ffffffffffffffa0;
  ParamSet *in_stack_ffffffffffffffa8;
  _Self local_40;
  _Self local_38;
  element_type *local_30;
  
  __args = in_RDI;
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x20235b);
  std::make_shared<pbrt::MirrorMaterial,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
  local_30 = std::
             __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x202379);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffea8);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffea8);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::MirrorMaterial,void>
                ((shared_ptr<pbrt::Material> *)in_stack_fffffffffffffeb0,
                 (shared_ptr<pbrt::MirrorMaterial> *)in_stack_fffffffffffffea8);
      std::shared_ptr<pbrt::MirrorMaterial>::~shared_ptr
                ((shared_ptr<pbrt::MirrorMaterial> *)0x202783);
      SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
      return (SP)SVar3.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x2023d6);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    std::__cxx11::string::string(local_a0,(string *)&stack0xffffffffffffff90);
    bVar1 = std::operator==(&in_stack_fffffffffffffeb0->first,(char *)in_stack_fffffffffffffea8);
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x202430);
      bVar1 = syntactic::ParamSet::hasParamTexture
                        (&in_stack_fffffffffffffec0->super_ParamSet,
                         (string *)
                         CONCAT17(in_stack_fffffffffffffebf,
                                  CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)));
      if (bVar1) {
        prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar2,"mapping Kr for mirror materials not implemented");
        __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      in_stack_fffffffffffffec0 =
           std::
           __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x20250b);
      std::__shared_ptr_access<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x20251d);
      syntactic::ParamSet::getParam3f
                (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    else {
      in_stack_fffffffffffffebf =
           std::operator==(&in_stack_fffffffffffffeb0->first,(char *)in_stack_fffffffffffffea8);
      if ((bool)in_stack_fffffffffffffebf) {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x202570);
        syntactic::ParamSet::getParamTexture(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        findOrCreateTexture(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        std::__shared_ptr_access<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::MirrorMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2025b3);
        std::shared_ptr<pbrt::Texture>::operator=
                  ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffeb0,
                   (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffea8);
        std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x2025d4);
        std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::Texture> *)0x2025e1);
      }
      else {
        in_stack_fffffffffffffebe =
             std::operator==(&in_stack_fffffffffffffeb0->first,(char *)in_stack_fffffffffffffea8);
        if (!(bool)in_stack_fffffffffffffebe) {
          uVar4 = 1;
          prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+((char *)CONCAT17(uVar4,in_stack_fffffffffffffef8),in_RDX);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffffebf,
                                  CONCAT16(in_stack_fffffffffffffebe,in_stack_fffffffffffffeb8)),
                         (char *)prVar2);
          std::runtime_error::runtime_error(prVar2,local_e0);
          __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffeb0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffeb0);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_mirror(pbrt::syntactic::Material::SP in)
  {
    MirrorMaterial::SP mat = std::make_shared<MirrorMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "Kr") {
        if (in->hasParamTexture(name)) {
          throw std::runtime_error("mapping Kr for mirror materials not implemented");
        } else
          in->getParam3f(&mat->kr.x,name);
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled mirror-material parameter '"+it.first+"'");
    };
    return mat;
  }